

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlBufDumpEnumeration(xmlOutputBufferPtr buf,xmlEnumerationPtr cur)

{
  if (cur != (xmlEnumerationPtr)0x0) {
    do {
      xmlOutputBufferWriteString(buf,(char *)cur->name);
      if (cur->next == (_xmlEnumeration *)0x0) break;
      xmlOutputBufferWrite(buf,3," | ");
      cur = cur->next;
    } while (cur != (_xmlEnumeration *)0x0);
  }
  xmlOutputBufferWrite(buf,1,")");
  return;
}

Assistant:

static void
xmlBufDumpEnumeration(xmlOutputBufferPtr buf, xmlEnumerationPtr cur) {
    while (cur != NULL) {
        xmlOutputBufferWriteString(buf, (const char *) cur->name);
        if (cur->next != NULL)
            xmlOutputBufferWrite(buf, 3, " | ");

        cur = cur->next;
    }

    xmlOutputBufferWrite(buf, 1, ")");
}